

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

void inproc_accept_clients(inproc_ep *srv)

{
  uint16_t *list;
  int iVar1;
  inproc_pipe *piVar2;
  inproc_pipe *piVar3;
  nni_aio *aio;
  nni_aio *aio_00;
  inproc_pair *rc;
  void *pvVar4;
  nni_list *list_00;
  long lVar5;
  nni_mtx *mtx;
  bool bVar6;
  inproc_pipe *local_48;
  inproc_pipe *cpipe;
  inproc_pipe *spipe;
  
  list_00 = &srv->clients;
  piVar2 = (inproc_pipe *)nni_list_first(list_00);
  do {
    if (piVar2 == (inproc_pipe *)0x0) {
      return;
    }
    piVar3 = (inproc_pipe *)nni_list_next(list_00,piVar2);
    list = &piVar2[2].peer;
    spipe = piVar2;
    aio = (nni_aio *)nni_list_first((nni_list *)list);
    while ((aio != (nni_aio *)0x0 &&
           (aio_00 = (nni_aio *)nni_list_first(&srv->aios), aio_00 != (nni_aio *)0x0))) {
      rc = (inproc_pair *)nni_zalloc(0xd8);
      if (rc == (inproc_pair *)0x0) {
        iVar1 = 2;
        inproc_conn_finish(aio,2,(inproc_ep *)spipe,(inproc_pipe *)0x0);
LAB_00122cbe:
        piVar2 = (inproc_pipe *)0x0;
      }
      else {
        mtx = &rc->queues[0].lock;
        lVar5 = 2;
        while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
          nni_aio_list_init((nni_list *)&mtx[-2].mtx.__data.__list.__next);
          nni_aio_list_init((nni_list *)((long)(mtx + -1) + 0x10));
          nni_mtx_init(mtx);
          mtx = (nni_mtx *)((long)&mtx[2].mtx + 0x10);
        }
        nni_refcnt_init((nni_refcnt *)rc,2,rc,inproc_pair_destroy);
        local_48 = (inproc_pipe *)0x0;
        cpipe = (inproc_pipe *)0x0;
        iVar1 = nni_pipe_alloc_dialer(&local_48,(nni_dialer *)spipe->recv_queue);
        if ((iVar1 != 0) || (iVar1 = nni_pipe_alloc_listener(&cpipe,srv->listener), iVar1 != 0)) {
          if (local_48 == (inproc_pipe *)0x0) {
            nni_refcnt_rele((nni_refcnt *)rc);
          }
          else {
            nni_pipe_close(local_48->pipe);
            nni_pipe_rele(local_48->pipe);
          }
          if (cpipe == (inproc_pipe *)0x0) {
            nni_refcnt_rele((nni_refcnt *)rc);
          }
          else {
            nni_pipe_close(cpipe->pipe);
            nni_pipe_rele(cpipe->pipe);
          }
          inproc_conn_finish(aio,iVar1,(inproc_ep *)spipe,(inproc_pipe *)0x0);
          goto LAB_00122cbe;
        }
        local_48->proto = *(uint16_t *)&spipe->pipe;
        local_48->addr = spipe->addr;
        cpipe->proto = srv->proto;
        cpipe->addr = srv->addr;
        local_48->peer = cpipe->proto;
        cpipe->peer = local_48->proto;
        local_48->pair = rc;
        cpipe->pair = rc;
        local_48->send_queue = rc->queues;
        local_48->recv_queue = rc->queues + 1;
        cpipe->send_queue = rc->queues + 1;
        cpipe->recv_queue = rc->queues;
        inproc_conn_finish(aio,0,(inproc_ep *)spipe,local_48);
        iVar1 = 0;
        piVar2 = cpipe;
      }
      inproc_conn_finish(aio_00,iVar1,srv,piVar2);
      aio = (nni_aio *)nni_list_next((nni_list *)list,aio);
    }
    pvVar4 = nni_list_first((nni_list *)list);
    piVar2 = piVar3;
    if ((pvVar4 == (void *)0x0) && (iVar1 = nni_list_active(list_00,spipe), iVar1 != 0)) {
      nni_list_remove(list_00,spipe);
    }
  } while( true );
}

Assistant:

static void
inproc_accept_clients(inproc_ep *srv)
{
	inproc_ep *cli, *nclient;

	nclient = nni_list_first(&srv->clients);
	while ((cli = nclient) != NULL) {
		nni_aio *caio;
		nclient = nni_list_next(&srv->clients, nclient);
		NNI_LIST_FOREACH (&cli->aios, caio) {

			inproc_pipe *cpipe;
			inproc_pipe *spipe;
			inproc_pair *pair;
			nni_aio     *saio;
			int          rv;

			if ((saio = nni_list_first(&srv->aios)) == NULL) {
				// No outstanding accept() calls.
				break;
			}

			if ((pair = NNI_ALLOC_STRUCT(pair)) == NULL) {
				inproc_conn_finish(
				    caio, NNG_ENOMEM, cli, NULL);
				inproc_conn_finish(
				    saio, NNG_ENOMEM, srv, NULL);
				continue;
			}
			for (int i = 0; i < 2; i++) {
				nni_aio_list_init(&pair->queues[i].readers);
				nni_aio_list_init(&pair->queues[i].writers);
				nni_mtx_init(&pair->queues[i].lock);
			}
			nni_refcnt_init(
			    &pair->ref, 2, pair, inproc_pair_destroy);

			spipe = cpipe = NULL;
			if (((rv = nni_pipe_alloc_dialer(
			          (void **) &cpipe, cli->dialer)) != 0) ||
			    ((rv = nni_pipe_alloc_listener(
			          (void **) &spipe, srv->listener)) != 0)) {

				if (cpipe != NULL) {
					nni_pipe_close(cpipe->pipe);
					nni_pipe_rele(cpipe->pipe);
				} else {
					nni_refcnt_rele(&pair->ref);
				}
				if (spipe != NULL) {
					nni_pipe_close(spipe->pipe);
					nni_pipe_rele(spipe->pipe);
				} else {
					nni_refcnt_rele(&pair->ref);
				}
				inproc_conn_finish(caio, rv, cli, NULL);
				inproc_conn_finish(saio, rv, srv, NULL);
				continue;
			}

			cpipe->proto      = cli->proto;
			cpipe->addr       = cli->addr;
			spipe->proto      = srv->proto;
			spipe->addr       = srv->addr;
			cpipe->peer       = spipe->proto;
			spipe->peer       = cpipe->proto;
			cpipe->pair       = pair;
			spipe->pair       = pair;
			cpipe->send_queue = &pair->queues[0];
			cpipe->recv_queue = &pair->queues[1];
			spipe->send_queue = &pair->queues[1];
			spipe->recv_queue = &pair->queues[0];

			inproc_conn_finish(caio, 0, cli, cpipe);
			inproc_conn_finish(saio, 0, srv, spipe);
		}

		if (nni_list_first(&cli->aios) == NULL) {
			// No more outstanding client connects.
			// Normally there should only be one.
			if (nni_list_active(&srv->clients, cli)) {
				nni_list_remove(&srv->clients, cli);
			}
		}
	}
}